

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

void __thiscall wallet::LegacyScriptPubKeyMan::GetKeys(LegacyScriptPubKeyMan *this)

{
  long in_RSI;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    GetKeys((set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *)this,
            (LegacyScriptPubKeyMan *)(in_RSI + -0x58));
    return;
  }
  __stack_chk_fail();
}

Assistant:

std::set<CKeyID> LegacyScriptPubKeyMan::GetKeys() const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        return FillableSigningProvider::GetKeys();
    }
    std::set<CKeyID> set_address;
    for (const auto& mi : mapCryptedKeys) {
        set_address.insert(mi.first);
    }
    return set_address;
}